

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairingHeap.h
# Opt level: O2

Node * PairingHeap<std::pair<double,_int>_>::backJoin(Node *pre,Node *cur)

{
  Node *pNVar1;
  bool bVar2;
  
  bVar2 = std::operator<(&cur->key,&pre->key);
  if (bVar2) {
    cur->porp = pre->porp;
    pNVar1 = cur->ch;
    pre->next = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->porp = pre;
    }
    pre->porp = cur;
    cur->ch = pre;
  }
  else {
    pre->next = (Node *)0x0;
    pNVar1 = pre->ch;
    cur->next = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->porp = cur;
    }
    cur->porp = pre;
    pre->ch = cur;
    cur = pre;
  }
  return cur;
}

Assistant:

static Node *backJoin(Node *pre, Node *cur)
	{
		if (cur->key < pre->key)
		{
			cur->porp = pre->porp;
			makeChildOf(pre, cur);
			return cur;
		}
		pre->next = nullptr;
		makeChildOf(cur, pre);
		return pre;
	}